

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkRestrashRandom(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar1 != 0) {
      printf("Warning: The choice nodes in the original AIG are removed by strashing.\n");
    }
    pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_NtkIncrementTravId(pNtk);
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_2c);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_NtkRestrashRandom_rec(pNtk_local,pAVar2);
    }
    Abc_NtkFinalize(pNtk,pNtk_local);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup(pNtk->pExdc);
      pNtk_local->pExdc = pAVar3;
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkStrash: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                ,0x8f,"Abc_Ntk_t *Abc_NtkRestrashRandom(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkRestrashRandom_rec( pNtkAig, Abc_ObjFanin0(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}